

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageMultisampleLoadStoreTests.cpp
# Opt level: O0

TestCaseGroup * vkt::image::createImageMultisampleLoadStoreTests(TestContext *testCtx)

{
  undefined1 *this;
  ImageType IVar1;
  uint uVar2;
  int iVar3;
  TestCaseGroup *pTVar4;
  char *pcVar5;
  TestNode *pTVar6;
  TestNode *pTVar7;
  ImageType imageType;
  ulong uVar8;
  ulong extraout_RDX;
  CaseDef local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  undefined1 local_194 [8];
  CaseDef caseDef;
  undefined1 local_150 [8];
  string samplesCaseName;
  int samplesNdx;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatGroup;
  undefined1 local_f8 [8];
  string formatGroupName;
  int local_d0;
  int iStack_cc;
  bool singleLayerBind;
  int layerBindMode;
  int formatNdx;
  int numLayerBindModes;
  undefined1 local_a0 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> imageViewGroup;
  Texture *baseTexture;
  DefaultDeleter<tcu::TestCaseGroup> local_7d;
  int baseTextureNdx;
  undefined1 local_70 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  Vector<int,_3> local_54;
  undefined1 local_48 [8];
  Texture textures [2];
  TestContext *testCtx_local;
  
  tcu::Vector<int,_3>::Vector(&local_54,0x20,0x20,1);
  Texture::Texture((Texture *)local_48,IMAGE_TYPE_2D,&local_54,1,1);
  this = &testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
          m_data.field_0x8;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,0x20,0x20,1);
  Texture::Texture((Texture *)&textures[0].m_numLayers,IMAGE_TYPE_2D_ARRAY,(IVec3 *)this,4,1);
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,testCtx,"load_store_multisample","Multisampled image store and load");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_7d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_70,pTVar4
            );
  for (baseTexture._4_4_ = 0; baseTexture._4_4_ < 2; baseTexture._4_4_ = baseTexture._4_4_ + 1) {
    imageViewGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data._8_8_ = &textures[(long)baseTexture._4_4_ + -1].m_numLayers;
    pTVar4 = (TestCaseGroup *)operator_new(0x70);
    formatNdx._3_1_ = 1;
    IVar1 = Texture::type((Texture *)
                          imageViewGroup.
                          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                          .m_data._8_8_);
    getImageTypeName_abi_cxx11_((string *)&numLayerBindModes,(image *)(ulong)IVar1,imageType);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup(pTVar4,testCtx,pcVar5,"");
    formatNdx._3_1_ = 0;
    de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
              ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&formatNdx + 2));
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_a0,
               pTVar4);
    std::__cxx11::string::~string((string *)&numLayerBindModes);
    uVar2 = Texture::numLayers((Texture *)
                               imageViewGroup.
                               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                               .m_data._8_8_);
    uVar8 = (ulong)uVar2;
    iVar3 = 2;
    if (uVar2 == 1) {
      iVar3 = 1;
    }
    for (iStack_cc = 0; iStack_cc < 0xd; iStack_cc = iStack_cc + 1) {
      for (local_d0 = 0; local_d0 < iVar3; local_d0 = local_d0 + 1) {
        formatGroupName.field_2._M_local_buf[0xf] = local_d0 != 0;
        getFormatShortString_abi_cxx11_
                  ((string *)
                   &formatGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.field_0x8,
                   (image *)(ulong)createImageMultisampleLoadStoreTests::formats[iStack_cc],
                   (VkFormat)uVar8);
        pcVar5 = "";
        if ((formatGroupName.field_2._M_local_buf[0xf] & 1U) != 0) {
          pcVar5 = "_single_layer";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &formatGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data.field_0x8,pcVar5);
        std::__cxx11::string::~string
                  ((string *)
                   &formatGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.field_0x8);
        pTVar4 = (TestCaseGroup *)operator_new(0x70);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        tcu::TestCaseGroup::TestCaseGroup(pTVar4,testCtx,pcVar5,"");
        de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
                  ((DefaultDeleter<tcu::TestCaseGroup> *)
                   (samplesCaseName.field_2._M_local_buf + 0xf));
        de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
                  ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                   &samplesNdx,pTVar4);
        for (samplesCaseName.field_2._8_4_ = 0; (int)samplesCaseName.field_2._8_4_ < 6;
            samplesCaseName.field_2._8_4_ = samplesCaseName.field_2._8_4_ + 1) {
          de::toString<vk::VkSampleCountFlagBits>
                    ((string *)&caseDef.numSamples,
                     createImageMultisampleLoadStoreTests::samples +
                     (int)samplesCaseName.field_2._8_4_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_150,"samples_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &caseDef.numSamples);
          std::__cxx11::string::~string((string *)&caseDef.numSamples);
          Texture::Texture((Texture *)local_194,
                           (Texture *)
                           imageViewGroup.
                           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                           .m_data._8_8_,
                           createImageMultisampleLoadStoreTests::samples
                           [(int)samplesCaseName.field_2._8_4_]);
          caseDef.texture.m_numLayers = createImageMultisampleLoadStoreTests::formats[iStack_cc];
          caseDef.texture.m_numSamples =
               createImageMultisampleLoadStoreTests::samples[(int)samplesCaseName.field_2._8_4_];
          caseDef.format._0_1_ =
               formatGroupName.field_2._M_local_buf[0xf] & VK_FORMAT_R4G4_UNORM_PACK8;
          pTVar4 = de::details::
                   UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                             ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                               *)&samplesNdx);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"",&local_1b9);
          anon_unknown_1::CaseDef::CaseDef(&local_1e0,(CaseDef *)local_194);
          addFunctionCaseWithPrograms<vkt::image::(anonymous_namespace)::CaseDef>
                    (pTVar4,(string *)local_150,&local_1b8,anon_unknown_1::initPrograms,
                     anon_unknown_1::test,&local_1e0);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::allocator<char>::~allocator(&local_1b9);
          std::__cxx11::string::~string((string *)local_150);
        }
        pTVar6 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_a0)->super_TestNode;
        pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                  ::release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                            &samplesNdx)->super_TestNode;
        tcu::TestNode::addChild(pTVar6,pTVar7);
        de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
                  ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                   &samplesNdx);
        std::__cxx11::string::~string((string *)local_f8);
        uVar8 = extraout_RDX;
      }
    }
    pTVar6 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_70)->super_TestNode;
    pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_a0)->super_TestNode;
    tcu::TestNode::addChild(pTVar6,pTVar7);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_a0);
  }
  pTVar4 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_70)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_70);
  return pTVar4;
}

Assistant:

tcu::TestCaseGroup* createImageMultisampleLoadStoreTests (tcu::TestContext& testCtx)
{
	const Texture textures[] =
	{
		// \note Shader code is tweaked to work with image size of 32, take a look if this needs to be modified.
		Texture(IMAGE_TYPE_2D,			tcu::IVec3(32,	32,	1),		1),
		Texture(IMAGE_TYPE_2D_ARRAY,	tcu::IVec3(32,	32,	1),		4),
	};

	static const VkFormat formats[] =
	{
		VK_FORMAT_R32G32B32A32_SFLOAT,
		VK_FORMAT_R16G16B16A16_SFLOAT,
		VK_FORMAT_R32_SFLOAT,

		VK_FORMAT_R32G32B32A32_UINT,
		VK_FORMAT_R16G16B16A16_UINT,
		VK_FORMAT_R8G8B8A8_UINT,
		VK_FORMAT_R32_UINT,

		VK_FORMAT_R32G32B32A32_SINT,
		VK_FORMAT_R16G16B16A16_SINT,
		VK_FORMAT_R8G8B8A8_SINT,
		VK_FORMAT_R32_SINT,

		VK_FORMAT_R8G8B8A8_UNORM,

		VK_FORMAT_R8G8B8A8_SNORM,
	};

	static const VkSampleCountFlagBits samples[] =
	{
		VK_SAMPLE_COUNT_2_BIT,
		VK_SAMPLE_COUNT_4_BIT,
		VK_SAMPLE_COUNT_8_BIT,
		VK_SAMPLE_COUNT_16_BIT,
		VK_SAMPLE_COUNT_32_BIT,
		VK_SAMPLE_COUNT_64_BIT,
	};

	MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "load_store_multisample", "Multisampled image store and load"));

	for (int baseTextureNdx = 0; baseTextureNdx < DE_LENGTH_OF_ARRAY(textures); ++baseTextureNdx)
	{
		const Texture&				baseTexture			= textures[baseTextureNdx];
		MovePtr<tcu::TestCaseGroup>	imageViewGroup		(new tcu::TestCaseGroup(testCtx, getImageTypeName(baseTexture.type()).c_str(), ""));
		const int					numLayerBindModes	= (baseTexture.numLayers() == 1 ? 1 : 2);

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); ++formatNdx)
		for (int layerBindMode = 0; layerBindMode < numLayerBindModes; ++layerBindMode)
		{
			const bool					singleLayerBind	= (layerBindMode != 0);
			const std::string			formatGroupName	= getFormatShortString(formats[formatNdx]) + (singleLayerBind ? "_single_layer" : "");
			MovePtr<tcu::TestCaseGroup>	formatGroup		(new tcu::TestCaseGroup(testCtx, formatGroupName.c_str(), ""));

			for (int samplesNdx = 0; samplesNdx < DE_LENGTH_OF_ARRAY(samples); ++samplesNdx)
			{
				const std::string	samplesCaseName = "samples_" + de::toString(samples[samplesNdx]);

				const CaseDef		caseDef =
				{
					Texture(baseTexture, samples[samplesNdx]),
					formats[formatNdx],
					samples[samplesNdx],
					singleLayerBind,
				};

				addFunctionCaseWithPrograms(formatGroup.get(), samplesCaseName, "", initPrograms, test, caseDef);
			}
			imageViewGroup->addChild(formatGroup.release());
		}
		testGroup->addChild(imageViewGroup.release());
	}

	return testGroup.release();
}